

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O2

void __thiscall
HighsSparseMatrix::createSlice
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,HighsInt from_col,HighsInt to_col)

{
  int iVar1;
  HighsInt HVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  long lVar9;
  long lVar10;
  size_type __new_size;
  long lVar11;
  
  HVar2 = matrix->num_row_;
  lVar11 = (long)to_col;
  iVar1 = (to_col - from_col) + 1;
  piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar10 = (long)from_col;
  __new_size = (long)piVar4[lVar11 + 1] - (long)piVar4[lVar10];
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)((to_col - from_col) + 2));
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,__new_size);
  piVar4 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar4[lVar10];
  piVar5 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = piVar5;
  for (lVar9 = lVar10; lVar9 <= lVar11; lVar9 = lVar9 + 1) {
    *piVar8 = piVar4[lVar9] - iVar3;
    piVar8 = piVar8 + 1;
  }
  piVar5[iVar1] = (int)__new_size;
  piVar5 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar9 = (long)piVar4[lVar10]; lVar9 < piVar4[lVar11 + 1]; lVar9 = lVar9 + 1) {
    piVar8[lVar9 - iVar3] = piVar5[lVar9];
    pdVar7[lVar9 - iVar3] = pdVar6[lVar9];
  }
  this->num_col_ = iVar1;
  this->num_row_ = HVar2;
  this->format_ = kColwise;
  return;
}

Assistant:

void HighsSparseMatrix::createSlice(const HighsSparseMatrix& matrix,
                                    const HighsInt from_col,
                                    const HighsInt to_col) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  HighsInt num_row = matrix.num_row_;
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& slice_start = this->start_;
  vector<HighsInt>& slice_index = this->index_;
  vector<double>& slice_value = this->value_;
  HighsInt slice_num_col = to_col + 1 - from_col;
  HighsInt slice_num_nz = a_start[to_col + 1] - a_start[from_col];
  slice_start.resize(slice_num_col + 1);
  slice_index.resize(slice_num_nz);
  slice_value.resize(slice_num_nz);
  HighsInt from_col_start = a_start[from_col];
  for (HighsInt iCol = from_col; iCol < to_col + 1; iCol++)
    slice_start[iCol - from_col] = a_start[iCol] - from_col_start;
  slice_start[slice_num_col] = slice_num_nz;
  for (HighsInt iEl = a_start[from_col]; iEl < a_start[to_col + 1]; iEl++) {
    slice_index[iEl - from_col_start] = a_index[iEl];
    slice_value[iEl - from_col_start] = a_value[iEl];
  }
  this->num_col_ = slice_num_col;
  this->num_row_ = num_row;
  this->format_ = MatrixFormat::kColwise;
}